

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mo.h
# Opt level: O3

int __thiscall GF2::MOGrevlex<8UL>::Compare(MOGrevlex<8UL> *this,MM<8UL> *m1,MM<8UL> *m2)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (m1->super_WW<8UL>)._words[0];
  uVar5 = uVar2 & 0xff;
  uVar3 = (m2->super_WW<8UL>)._words[0];
  uVar4 = uVar3 & 0xff;
  if (WW<8ul>::Weight()::_bitsperoctet[uVar5] == WW<8ul>::Weight()::_bitsperoctet[uVar4]) {
    if (uVar2 == uVar3) {
      return 0;
    }
    if ((int)uVar5 == (int)uVar4) {
      do {
        uVar2 = uVar2 >> 8;
        uVar3 = uVar3 >> 8;
        uVar5 = uVar2 & 0xff;
        uVar4 = uVar3 & 0xff;
      } while (uVar5 == uVar4);
    }
    uVar1 = (""[uVar5] < ""[uVar4]) - 1;
  }
  else {
    uVar1 = -(uint)((byte)WW<8ul>::Weight()::_bitsperoctet[uVar5] <
                   (byte)WW<8ul>::Weight()::_bitsperoctet[uVar4]);
  }
  return uVar1 | 1;
}

Assistant:

int Compare(const MM<_n>& m1, const MM<_n>& m2) const
	{
		int nDiff = m1.Deg() - m2.Deg();
		// степени отличаются?
		if (nDiff != 0)
			return (nDiff < 0) ? -1 : 1;

		size_t pos = 0;
		// найти самые левые различные слова
		while (pos < m1.WordSize() && m1.GetWord(pos) == m2.GetWord(pos)) 
			pos++; 
		// различий не найдено?
		if (pos == m1.WordSize()) return 0;
		// в словах экспонент левые координаты являтся младшими разрядами,
		// поэтому разряды приходится разворачивать
		word w1 = m1.GetWord(pos), w2 = m2.GetWord(pos);
		// находим самые младшие несовпадающие байты
		for (; (w1 & 255) == (w2 & 255); w1 >>= 8, w2 >>= 8);
		// делаем разворот разрядов байта
		static const u8 _revbyte[256] = 
		{
			 0,128,64,192,32,160, 96,224,16,144,80,208,48,176,112,240,
			 8,136,72,200,40,168,104,232,24,152,88,216,56,184,120,248,
			 4,132,68,196,36,164,100,228,20,148,84,212,52,180,116,244,
			12,140,76,204,44,172,108,236,28,156,92,220,60,188,124,252,
			 2,130,66,194,34,162, 98,226,18,146,82,210,50,178,114,242,
			10,138,74,202,42,170,106,234,26,154,90,218,58,186,122,250,
			 6,134,70,198,38,166,102,230,22,150,86,214,54,182,118,246,
			14,142,78,206,46,174,110,238,30,158,94,222,62,190,126,254,
			 1,129,65,193,33,161, 97,225,17,145,81,209,49,177,113,241,
			 9,137,73,201,41,169,105,233,25,153,89,217,57,185,121,249,
			 5,133,69,197,37,165,101,229,21,149,85,213,53,181,117,245,
			13,141,77,205,45,173,109,237,29,157,93,221,61,189,125,253,
			 3,131,67,195,35,163, 99,227,19,147,83,211,51,179,115,243,
			11,139,75,203,43,171,107,235,27,155,91,219,59,187,123,251,
			 7,135,71,199,39,167,103,231,23,151,87,215,55,183,119,247,
			15,143,79,207,47,175,111,239,31,159,95,223,63,191,127,255,
		};
		// и сравниваем "байты-как-числа"
		if (_revbyte[w1 & 255] < _revbyte[w2 & 255])
			return 1;
		return -1;
	}